

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPCInstPrinter.c
# Opt level: O0

void printS16ImmOperand_Mem(MCInst *MI,uint OpNo,SStream *O)

{
  cs_detail *pcVar1;
  _Bool _Var2;
  short sVar3;
  MCOperand *pMVar4;
  int64_t iVar5;
  uint8_t *puVar6;
  short Imm;
  SStream *O_local;
  uint OpNo_local;
  MCInst *MI_local;
  
  pMVar4 = MCInst_getOperand(MI,OpNo);
  _Var2 = MCOperand_isImm(pMVar4);
  if (_Var2) {
    pMVar4 = MCInst_getOperand(MI,OpNo);
    iVar5 = MCOperand_getImm(pMVar4);
    sVar3 = (short)iVar5;
    if (sVar3 != 0) {
      if (sVar3 < 0) {
        if (sVar3 < -9) {
          SStream_concat(O,"-0x%x",(ulong)(uint)-(int)sVar3);
        }
        else {
          SStream_concat(O,"-%u",(ulong)(uint)-(int)sVar3);
        }
      }
      else if (sVar3 < 10) {
        SStream_concat(O,"%u",(ulong)(uint)(int)sVar3);
      }
      else {
        SStream_concat(O,"0x%x",(ulong)(uint)(int)sVar3);
      }
      if (MI->csh->detail != CS_OPT_OFF) {
        if ((MI->csh->doing_mem & 1U) == 0) {
          puVar6 = MI->flat_insn->detail->groups +
                   (ulong)(MI->flat_insn->detail->field_6).x86.addr_size * 0x10 + 0x1a;
          puVar6[0] = '\x02';
          puVar6[1] = '\0';
          puVar6[2] = '\0';
          puVar6[3] = '\0';
          *(int *)(MI->flat_insn->detail->groups +
                  (ulong)(MI->flat_insn->detail->field_6).x86.addr_size * 0x10 + 0x1e) = (int)sVar3;
          pcVar1 = MI->flat_insn->detail;
          (pcVar1->field_6).x86.addr_size = (pcVar1->field_6).x86.addr_size + '\x01';
        }
        else {
          *(int *)(MI->flat_insn->detail->groups +
                  (ulong)(MI->flat_insn->detail->field_6).x86.addr_size * 0x10 + 0x22) = (int)sVar3;
        }
      }
    }
  }
  else {
    printOperand(MI,OpNo,O);
  }
  return;
}

Assistant:

static void printS16ImmOperand_Mem(MCInst *MI, unsigned OpNo, SStream *O)
{
	if (MCOperand_isImm(MCInst_getOperand(MI, OpNo))) {
		short Imm = (short)MCOperand_getImm(MCInst_getOperand(MI, OpNo));
		// Do not print zero offset
		if (Imm == 0)
			return;

		if (Imm >= 0) {
			if (Imm > HEX_THRESHOLD)
				SStream_concat(O, "0x%x", Imm);
			else
				SStream_concat(O, "%u", Imm);
		} else {
			if (Imm < -HEX_THRESHOLD)
				SStream_concat(O, "-0x%x", -Imm);
			else
				SStream_concat(O, "-%u", -Imm);
		}

		if (MI->csh->detail) {
			if (MI->csh->doing_mem) {
				MI->flat_insn->detail->ppc.operands[MI->flat_insn->detail->ppc.op_count].mem.disp = Imm;
			} else {
				MI->flat_insn->detail->ppc.operands[MI->flat_insn->detail->ppc.op_count].type = PPC_OP_IMM;
				MI->flat_insn->detail->ppc.operands[MI->flat_insn->detail->ppc.op_count].imm = Imm;
				MI->flat_insn->detail->ppc.op_count++;
			}
		}
	} else
		printOperand(MI, OpNo, O);
}